

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O1

int eatcorpse(obj *otmp)

{
  byte bVar1;
  ushort uVar2;
  boolean bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  long lVar14;
  char *pcVar15;
  bool bVar16;
  char buf [256];
  char local_138 [264];
  uint uVar13;
  
  uVar6 = otmp->corpsenm;
  lVar14 = (long)(int)uVar6;
  uVar2 = mons[lVar14].geno;
  if (lVar14 == 0xc) {
    if (u.uprops[8].extrinsic == 0) {
LAB_001913ae:
      if (((byte)youmonst.mintrinsics & 0x80) == 0) {
        bVar3 = poly_when_stoned(youmonst.data);
        bVar16 = bVar3 == '\0';
        goto LAB_001913ce;
      }
    }
    bVar16 = false;
  }
  else {
    bVar16 = false;
    if ((uVar6 == 0xb) && (u.uprops[8].extrinsic == 0)) goto LAB_001913ae;
  }
LAB_001913ce:
  bVar1 = mons[lVar14].mlet;
  iVar5 = 7;
  uVar12 = (uint)bVar1;
  uVar13 = (uint)bVar1;
  if (bVar1 < 0x1f) {
    if (bVar1 < 0x16) {
      if ((uVar13 == 2) || (uVar13 == 10)) {
LAB_0019147e:
        iVar5 = 5;
      }
    }
    else if ((uVar13 == 0x16) || (uVar13 == 0x19)) goto LAB_0019147e;
  }
  else if (bVar1 < 0x2a) {
    if (uVar13 != 0x1f) {
      if (bVar1 == 0x20) goto LAB_0019147e;
      goto LAB_00191483;
    }
    if (uVar6 == 0x9e) goto LAB_001913e5;
LAB_0019145c:
    iVar5 = 6;
    if (uVar12 < 0x38) {
      uVar10 = (ulong)uVar12;
      if ((0x40000102400404U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_0019147e;
      if (uVar10 == 0x1f) {
        if ((uVar6 != 0x9e) || (uVar12 == 0x36)) goto LAB_0019147e;
        if (uVar12 == 0x37) goto LAB_001915fb;
      }
      else if (uVar10 == 0x37) {
LAB_001915fb:
        if (((uVar6 | 2) != 0x106) || (bVar1 == 0x36)) goto LAB_0019147e;
      }
    }
  }
  else {
LAB_001913e5:
    if (bVar1 == 0x2a) {
LAB_00191418:
      if (uVar6 != 0xd6) goto LAB_0019145c;
    }
    else {
      if (uVar13 == 0x36) goto LAB_0019147e;
      if (uVar13 == 0x37) {
        if ((uVar6 | 2) != 0x106) goto LAB_0019145c;
        if (uVar12 == 0x36) goto LAB_0019147e;
        if (uVar12 == 0x2a) goto LAB_00191418;
      }
    }
  }
LAB_00191483:
  uVar2 = uVar2 >> 0xc;
  violated(iVar5);
  lVar7 = 0;
  if ((uVar6 != 0xa3) && (uVar6 != 0x154)) {
    lVar7 = peek_at_iced_corpse_age(otmp);
    uVar10 = (ulong)moves;
    uVar4 = mt_random();
    lVar7 = (long)(uVar10 - lVar7) / (long)(ulong)(uVar4 % 0x14 + 10);
    if ((*(uint *)&otmp->field_0x4a & 1) == 0) {
      if ((*(uint *)&otmp->field_0x4a & 2) != 0) {
        lVar7 = lVar7 + -2;
      }
    }
    else {
      lVar7 = lVar7 + 2;
    }
  }
  if (((youmonst.data)->mlet == '0') ||
     (youmonst.data == mons + 0x85 || ((youmonst.data)->mflags2 & 0x100) != 0)) {
    if ((otmp->field_0x4d & 8) == 0) {
      if ((uint)mons[otmp->corpsenm].cnutrit <= otmp->oeaten) {
LAB_00191550:
        if ((0 < lVar7) || (lVar8 = peek_at_iced_corpse_age(otmp), lVar8 + 5 < (long)(ulong)moves))
        {
          pcVar11 = "The blood in this corpse has coagulated!";
          goto LAB_00191591;
        }
        if (((uVar2 & 1) == 0) ||
           (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
            ((u.umonnum == u.umonster || (bVar3 = dmgtype(youmonst.data,0x24), bVar3 == '\0')))))) {
          pcVar11 = corpse_xname(otmp,'\x01');
          pcVar11 = the(pcVar11);
          strcpy(local_138,pcVar11);
        }
        else {
          pcVar11 = "";
          if ((mons[lVar14].mflags2 & 0x80000) == 0) {
            pcVar11 = "the ";
          }
          pcVar9 = s_suffix(mons[lVar14].mname);
          sprintf(local_138,"%s%s corpse",pcVar11,pcVar9);
        }
        pline("You drain the blood from %s.");
        otmp->field_0x4d = otmp->field_0x4d | 8;
        goto LAB_001916c3;
      }
    }
    else if ((uint)((ulong)mons[otmp->corpsenm].cnutrit * 0xccccccd0 >> 0x20) < otmp->oeaten)
    goto LAB_00191550;
    pcVar11 = "There is no blood left in this corpse!";
LAB_00191591:
    pline(pcVar11);
    return 3;
  }
  otmp->field_0x4d = otmp->field_0x4d & 0xf7;
LAB_001916c3:
  if ((!(bool)(uVar6 == 8 | bVar16)) && (5 < lVar7)) {
    bVar3 = maybe_cannibal(uVar6,'\0');
    if (bVar1 < 0x1f) {
      if (uVar13 == 0x15 || bVar1 < 0x15) {
        if ((uVar13 == 2) || (uVar13 == 10)) {
LAB_00191ad0:
          pcVar11 = "protoplasm";
          goto LAB_00191afa;
        }
      }
      else if ((uVar12 == 0x16) || (uVar12 == 0x19)) goto LAB_00191ad0;
    }
    else {
      if (uVar12 == 0x35 || bVar1 < 0x35) {
        if (uVar12 != 0x1f) {
          if (bVar1 == 0x20) {
            pcVar11 = "fungoid vegetation";
            goto LAB_00191afa;
          }
          goto LAB_00191ad9;
        }
        pcVar11 = "protoplasm";
        if (uVar6 != 0x9e) goto LAB_00191afa;
      }
      else if (uVar12 == 0x36) goto LAB_00191ad0;
      if ((bVar1 == 0x37) && (((uVar6 | 2) != 0x106 || (uVar13 == 0x36)))) goto LAB_00191ad0;
    }
LAB_00191ad9:
    pcVar11 = "protoplasm";
    if (uVar13 != 0x2a) {
      pcVar11 = "meat";
    }
    if (uVar6 == 0xd6) {
      pcVar11 = "meat";
    }
LAB_00191afa:
    pcVar15 = "";
    pcVar9 = "; you cannibal";
    if (bVar3 == '\0') {
      pcVar9 = "";
    }
    pline("Ulch!  That %s was tainted%s!",pcVar11,pcVar9);
    if (((u.uprops[0x34].intrinsic == 0) &&
        (youmonst.data != mons + 0xfd && (youmonst.data)->mlet != ' ')) &&
       (bVar3 = defends(0x21,uwep), bVar3 == '\0')) {
      uVar6 = mt_random();
      uVar6 = uVar6 % 10 + 10;
      uVar10 = 1;
      if (u.uprops[0x1d].intrinsic != 1) {
        uVar10 = (ulong)u.uprops[0x1d].intrinsic - 1;
      }
      if (uVar6 <= u.uprops[0x1d].intrinsic) {
        uVar10 = (ulong)uVar6;
      }
      if (u.uprops[0x1d].intrinsic == 0) {
        uVar10 = (ulong)uVar6;
      }
      if ((uVar2 & 1) == 0) {
        pcVar11 = corpse_xname(otmp,'\x01');
        sprintf(local_138,"rotted %s",pcVar11);
      }
      else {
        if ((mons[lVar14].mflags2 & 0x80000) == 0) {
          pcVar15 = "the ";
        }
        pcVar11 = mons_mname(mons + lVar14);
        pcVar11 = s_suffix(pcVar11);
        sprintf(local_138,"%s%s rotted corpse",pcVar15,pcVar11);
      }
      make_sick(uVar10,local_138,'\x01',1);
    }
    else {
      pline("It doesn\'t seem at all sickening, though...");
    }
    if (otmp->where == '\x03') {
      useup(otmp);
    }
    else {
      useupf(otmp,1);
    }
    return 2;
  }
  uVar12 = mons[lVar14].mflags1;
  if ((((uVar12 >> 0x1b & 1) == 0) || (u.uprops[7].extrinsic != 0)) ||
     (((byte)youmonst.mintrinsics & 0x40) != 0)) {
    if (((uVar12 >> 0x1c & 1) == 0) || (uVar4 = mt_random(), uVar4 * -0x33333333 < 0x33333334)) {
      bVar16 = true;
      if ((((5 < lVar7) ||
           ((3 < lVar7 && (uVar4 = mt_random(), bVar16 = true, 0x33333333 < uVar4 * -0x33333333))))
          && (bVar16 = true, u.uprops[0x34].intrinsic == 0)) &&
         ((bVar16 = true, youmonst.data != mons + 0xfd && (youmonst.data)->mlet != ' ' &&
          (bVar3 = defends(0x21,uwep), bVar3 == '\0')))) {
        pcVar11 = "very ";
        if (u.uprops[0x1d].intrinsic == 0) {
          pcVar11 = "";
        }
        pline("You feel %ssick.",pcVar11);
        uVar4 = mt_random();
        losehp((uVar4 & 7) + 1,"cadaver",0);
        bVar16 = false;
      }
    }
    else {
      pline("Ecch - that must have been poisonous!");
      if (((u.uprops[6].intrinsic == 0 && u.uprops[6].extrinsic == 0) &&
          (((byte)youmonst.mintrinsics & 0x20) == 0)) ||
         (((u.uprops[6].intrinsic >> 0x1a & 1) != 0 &&
          (((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0 &&
           (((byte)youmonst.mintrinsics & 0x20) == 0)))))) {
        if ((u.uprops[6].intrinsic == 0 && u.uprops[6].extrinsic == 0) &&
           (((byte)youmonst.mintrinsics & 0x20) == 0)) {
          uVar4 = mt_random();
          losestr((uVar4 & 3) + 1,'\0');
        }
        uVar10 = 0xf;
        if (((u.uprops[6].intrinsic >> 0x1a & 1) != 0) &&
           ((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0)) {
          uVar10 = (ulong)((uint)(((byte)youmonst.mintrinsics & 0x20) >> 5) * 8 + 7);
        }
        uVar4 = mt_random();
        losehp((int)((ulong)uVar4 % uVar10) + 1,"poisonous corpse",0);
      }
      else {
        pline("You seem unaffected by the poison.");
      }
      exercise(4,'\0');
      bVar16 = false;
    }
  }
  else {
    bVar16 = false;
    pline("You have a very bad case of stomach acid.");
    uVar4 = mt_random();
    losehp(uVar4 % 0xf + 1,"acidic corpse",0);
  }
  lVar7 = (ulong)(mons[lVar14].cwt >> 6) + 3;
  victual.reqtime = (int)lVar7;
  if ((otmp->field_0x4d & 8) != 0) {
    victual.reqtime = rounddiv(lVar7,5);
  }
  if ((((bVar16) && (uVar6 != 0xa3)) && (uVar6 != 0x154)) &&
     (((otmp->field_0x4b & 3) != 0 || (uVar4 = mt_random(), uVar4 * -0x49249249 < 0x24924925)))) {
    iVar5 = rottenfood(otmp);
    if (iVar5 != 0) {
      *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfffffcff | 0x100;
      touchfood(otmp);
    }
    uVar6 = (uint)(iVar5 != 0);
    if (mons[otmp->corpsenm].cnutrit == 0) {
      if (iVar5 == 0) {
        pline("The corpse rots away completely.");
      }
      if (otmp->where == '\x03') {
        useup(otmp);
      }
      else {
        useupf(otmp,1);
      }
      uVar6 = 2;
    }
    if ((uVar6 == 0) && (uVar4 = otmp->oeaten, otmp->oeaten = uVar4 >> 2, uVar4 < 4)) {
      if (victual.piece == otmp) {
        victual.reqtime = victual.usedtime;
      }
      otmp->oeaten = 1;
    }
    uVar4 = 2;
    if (((uVar6 < 2) && (uVar4 = uVar6, (otmp->field_0x4d & 8) != 0)) &&
       (uVar6 = (uint)((ulong)mons[otmp->corpsenm].cnutrit * 0xccccccd0 >> 0x20),
       otmp->oeaten < uVar6)) {
      otmp->oeaten = uVar6;
    }
    goto LAB_00191e8b;
  }
  uVar4 = 0;
  if (((youmonst.data)->mlet == '0') ||
     (youmonst.data == mons + 0x85 || ((youmonst.data)->mflags2 & 0x100) != 0)) goto LAB_00191e8b;
  if ((uVar2 & 1) == 0) {
    pcVar11 = "This ";
  }
  else {
    pcVar11 = "";
    if ((mons[lVar14].mflags2 & 0x80000) == 0) {
      pcVar11 = "The ";
    }
  }
  pcVar9 = food_xname(otmp,'\0');
  if (uVar13 < 0x38) {
    uVar10 = (ulong)uVar13;
    if ((0x40000102400404U >> (uVar10 & 0x3f) & 1) == 0) {
      if (uVar10 == 0x1f) {
        if ((uVar6 != 0x9e) || (uVar13 == 0x36)) goto LAB_00191be8;
        if (uVar13 == 0x37) goto LAB_00191cff;
      }
      else if (uVar10 == 0x37) {
LAB_00191cff:
        if (((uVar6 | 2) != 0x106) || (uVar13 == 0x36)) goto LAB_00191be8;
      }
      goto LAB_00191deb;
    }
LAB_00191be8:
    uVar6 = (uint)(((youmonst.data)->mflags1 >> 0x1d & 1) == 0) & (youmonst.data)->mflags1 >> 0x1e;
  }
  else {
LAB_00191deb:
    uVar6 = (uint)(((youmonst.data)->mflags1 & 0x60000000) == 0x20000000);
  }
  pcVar15 = "is delicious";
  if (uVar6 == 0) {
    pcVar15 = "tastes terrible";
  }
  pline("%s%s %s!",pcVar11,pcVar9,pcVar15);
  uVar4 = 0;
LAB_00191e8b:
  if (((uVar13 == 2 || (uVar12 & 0x80004) != 0) &&
      ((0x2d < uVar13 || ((0x210000002000U >> ((ulong)uVar13 & 0x3f) & 1) == 0)))) &&
     ((uVar6 = mt_random(), uVar6 * -0x33333333 < 0x33333334 &&
      (((youmonst.data)->mlet != '0' &&
       (youmonst.data != mons + 0x85 && ((youmonst.data)->mflags2 & 0x100) == 0)))))) {
    pcVar11 = "glibbery";
    if ((uVar12 & 4) == 0) {
      pcVar11 = "slimy";
    }
    pcVar9 = body_part(3);
    pcVar9 = makeplural(pcVar9);
    pcVar15 = "even more";
    if (u.uprops[0x29].intrinsic == 0) {
      pcVar15 = "very";
    }
    pline("Eating this %s corpse makes your %s %s slippery.",pcVar11,pcVar9,pcVar15);
    uVar6 = mt_random();
    incr_itimeout(&u.uprops[0x29].intrinsic,(ulong)(uVar6 % 0xf + 1));
  }
  return uVar4;
}

Assistant:

static int eatcorpse(struct obj *otmp)
{
	int tp = 0, mnum = otmp->corpsenm;
	long rotted = 0L;
	boolean uniq = !!(mons[mnum].geno & G_UNIQ);
	int retcode = 0;
	boolean stoneable = (touch_petrifies(&mons[mnum]) && !Stone_resistance &&
				!poly_when_stoned(youmonst.data));

	/* KMH, conduct */
	/* eating a corpse breaks food-conducts here */
	if (!vegetarian(&mons[mnum])) violated(CONDUCT_VEGETARIAN);
	else if (!vegan(&mons[mnum])) violated(CONDUCT_VEGAN);
	else violated(CONDUCT_FOODLESS);

	if (mnum != PM_LIZARD && mnum != PM_LICHEN) {
		long age = peek_at_iced_corpse_age(otmp);

		rotted = (moves - age)/(10L + rn2(20));
		if (otmp->cursed) rotted += 2L;
		else if (otmp->blessed) rotted -= 2L;
	}

	/* Vampires only drink the blood of very young, meaty corpses.
	 * is_edible only allows meaty corpses here.
	 * Blood is assumed to be 1/5 of the nutrition.
	 * Thus happens before the conduct checks intentionally - should it be after?
	 * Blood is assumed to be meat and flesh.
	 */
	if (is_vampiric(youmonst.data)) {
		/* oeaten is set up by touchfood */
		if (otmp->odrained ?
		    otmp->oeaten <= drainlevel(otmp) :
		    otmp->oeaten < mons[otmp->corpsenm].cnutrit) {
			pline("There is no blood left in this corpse!");
			return 3;
		} else if (rotted <= 0 &&
			   peek_at_iced_corpse_age(otmp) + 5 >= moves) {
			char buf[BUFSZ];

			/* Generate the name for the corpse */
			if (!uniq || Hallucination)
				sprintf(buf, "%s", the(corpse_xname(otmp, TRUE)));
			else
				sprintf(buf, "%s%s corpse",
					!type_is_pname(&mons[mnum]) ? "the " : "",
					s_suffix(mons[mnum].mname));

			pline("You drain the blood from %s.", buf);
			otmp->odrained = 1;
		} else {
			pline("The blood in this corpse has coagulated!");
			return 3;
		}
	} else {
		otmp->odrained = 0;
	}

	if (mnum != PM_ACID_BLOB && !stoneable && rotted > 5L) {
		boolean cannibal = maybe_cannibal(mnum, FALSE);
		pline("Ulch!  That %s was tainted%s!",
		      mons[mnum].mlet == S_FUNGUS ? "fungoid vegetation" :
		      !vegetarian(&mons[mnum]) ? "meat" : "protoplasm",
		      cannibal ? "; you cannibal" : "");
		if (Sick_resistance) {
			pline("It doesn't seem at all sickening, though...");
		} else {
			char buf[BUFSZ];
			long sick_time;

			sick_time = (long) rn1(10, 10);
			/* make sure new ill doesn't result in improvement */
			if (Sick && (sick_time > Sick))
			    sick_time = (Sick > 1L) ? Sick - 1L : 1L;
			if (!uniq)
			    sprintf(buf, "rotted %s", corpse_xname(otmp,TRUE));
			else
			    sprintf(buf, "%s%s rotted corpse",
				    !type_is_pname(&mons[mnum]) ? "the " : "",
				    s_suffix(mons_mname(&mons[mnum])));
			make_sick(sick_time, buf, TRUE, SICK_VOMITABLE);
		}
		if (carried(otmp)) useup(otmp);
		else useupf(otmp, 1L);
		return 2;
	} else if (acidic(&mons[mnum]) && !Acid_resistance) {
		tp++;
		pline("You have a very bad case of stomach acid."); /* not body_part() */
		losehp(rnd(15), "acidic corpse", KILLED_BY_AN);
	} else if (poisonous(&mons[mnum]) && rn2(5)) {
		tp++;
		pline("Ecch - that must have been poisonous!");
		if (!FPoison_resistance) {
			if (!Poison_resistance)
			    losestr(rnd(4), FALSE);
			losehp(rnd(PPoison_resistance ? 7 : 15),
			       "poisonous corpse", KILLED_BY_AN);
		} else	pline("You seem unaffected by the poison.");
		exercise(A_CON, FALSE);
	/* now any corpse left too long will make you mildly ill */
	} else if ((rotted > 5L || (rotted > 3L && rn2(5)))
					&& !Sick_resistance) {
		tp++;
		pline("You feel %ssick.", (Sick) ? "very " : "");
		losehp(rnd(8), "cadaver", KILLED_BY_AN);
	}

	/* delay is weight dependent */
	victual.reqtime = 3 + (mons[mnum].cwt >> 6);
	if (otmp->odrained)
		victual.reqtime = rounddiv(victual.reqtime, 5);

	if (!tp && mnum != PM_LIZARD && mnum != PM_LICHEN &&
			(otmp->orotten || !rn2(7))) {
	    if (rottenfood(otmp)) {
		otmp->orotten = TRUE;
		touchfood(otmp);
		retcode = 1;
	    }

	    if (!mons[otmp->corpsenm].cnutrit) {
		/* no nutrution: rots away, no message if you passed out */
		if (!retcode) pline("The corpse rots away completely.");
		if (carried(otmp)) useup(otmp);
		else useupf(otmp, 1L);
		retcode = 2;
	    }

	    if (!retcode) consume_oeaten(otmp, 2);	/* oeaten >>= 2 */
	    if (retcode < 2 && otmp->odrained && otmp->oeaten < drainlevel(otmp))
		otmp->oeaten = drainlevel(otmp);
	} else if (!is_vampiric(youmonst.data)) {
	    pline("%s%s %s!",
		  !uniq ? "This " : !type_is_pname(&mons[mnum]) ? "The " : "",
		  food_xname(otmp, FALSE),
		  (vegan(&mons[mnum]) ?
		   (!carnivorous(youmonst.data) && herbivorous(youmonst.data)) :
		   (carnivorous(youmonst.data) && !herbivorous(youmonst.data)))
		  ? "is delicious" : "tastes terrible");
	}

	/* Eating slimy or oily corpses makes your fingers slippery.
	 * Note: Snakes are not slimy. */
	if ((amorphous(&mons[mnum]) || slithy(&mons[mnum]) ||
	     mons[mnum].mlet == S_BLOB) &&
	    mons[mnum].mlet != S_SNAKE && mons[mnum].mlet != S_NAGA &&
	    mons[mnum].mlet != S_MIMIC && rnf(1,5) &&
	    !is_vampiric(youmonst.data)) {
	    pline("Eating this %s corpse makes your %s %s slippery.",
		  amorphous(&mons[mnum]) ? "glibbery" : "slimy",
		  makeplural(body_part(FINGER)),
		  Glib ? "even more" : "very");
	    incr_itimeout(&Glib, rnd(15));
	}

	return retcode;
}